

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_not_present_exception::~option_not_present_exception
          (option_not_present_exception *this)

{
  void *in_RDI;
  
  ~option_not_present_exception((option_not_present_exception *)0x147a68);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit option_not_present_exception(const std::string& option)
    : OptionParseException("Option " + LQUOTE + option + RQUOTE + " not present")
    {
    }